

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O3

void __thiscall
wasm::DuplicateFunctionElimination::run(DuplicateFunctionElimination *this,Module *module)

{
  PassRunner *pPVar1;
  pointer puVar2;
  Function *pFVar3;
  iterator __position;
  Function *right;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  mapped_type *pmVar7;
  vector<wasm::Function*,std::allocator<wasm::Function*>> *this_00;
  const_iterator cVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  _Base_ptr *pp_Var11;
  pointer puVar12;
  size_t sVar13;
  undefined **ppuVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined1 local_258 [8];
  Map hashes;
  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  code *local_100;
  ulong local_f8;
  ulong local_f0;
  undefined **local_e8;
  Module *local_e0;
  undefined **local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  undefined1 local_b0 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  replacements;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> duplicates;
  long local_48;
  ulong local_38;
  
  pPVar1 = (this->super_Pass).runner;
  iVar15 = (pPVar1->options).optimizeLevel;
  if ((iVar15 < 3) && ((pPVar1->options).shrinkLevel < 1)) {
    local_38 = (ulong)((uint)(iVar15 == 2) * 9 + 1);
  }
  else {
    local_38 = (ulong)((long)(module->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(module->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
    if ((int)local_38 == 0) {
      return;
    }
  }
  ppuVar14 = &PTR__FunctionHasher_00d73530;
  local_e8 = &PTR__Pass_00d722d8;
  local_d8 = &PTR__FunctionHasher_00d73530;
  local_e0 = module;
  while( true ) {
    pp_Var11 = &hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    FunctionHasher::createMap((Map *)local_258,module);
    hashGroups._M_t._M_impl._0_8_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_110 = 0;
    local_118 = ExpressionAnalyzer::nothingHasher;
    local_100 = std::
                _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
                ::_M_manager;
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ppuVar14;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pp_Var11;
    WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
           *)&hashes.
              super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count,(this->super_Pass).runner,module);
    if (local_108 != (code *)0x0) {
      hashes.
      super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ppuVar14;
      (*local_108)(&local_118,&local_118,3);
    }
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_e8;
    if ((_Base_ptr *)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != pp_Var11) {
      operator_delete((void *)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                      (ulong)((long)&(hashGroups._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_left)->_M_color + 1));
    }
    hashGroups._M_t._M_impl._0_8_ = hashGroups._M_t._M_impl._0_8_ & 0xffffffff00000000;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&hashGroups;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    puVar12 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (puVar12 != puVar2) {
      do {
        pFVar3 = (puVar12->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar3->super_Importable).module + 8) == (char *)0x0) {
          local_b0 = (undefined1  [8])pFVar3;
          pmVar7 = std::
                   map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                   ::operator[]((map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                                 *)local_258,(key_type *)local_b0);
          replacements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (undefined4)*pmVar7;
          this_00 = (vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                    std::
                    map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                    ::operator[]((map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                  *)&hashes.
                                     super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                                     ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type *)
                                 &replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
          __position._M_current = *(Function ***)(this_00 + 8);
          if (__position._M_current == *(Function ***)(this_00 + 0x10)) {
            std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
            _M_realloc_insert<wasm::Function*const&>(this_00,__position,(Function **)local_b0);
          }
          else {
            *__position._M_current = (Function *)local_b0;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar2);
    }
    replacements._M_t._M_impl._0_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&replacements;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&replacements;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    duplicates._M_t._M_impl._0_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&duplicates;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&duplicates;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    if (hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)&hashGroups)
    break;
    uVar6 = (int)local_38 - 1;
    local_38 = (ulong)uVar6;
    p_Var10 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      uVar16 = (ulong)((long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent) >> 3;
      iVar15 = (int)uVar16;
      if (iVar15 != 1) {
        local_f0 = uVar16 & 0xffffffff;
        local_f8 = (ulong)(iVar15 - 1);
        local_48 = 1;
        sVar13 = 0;
        do {
          pFVar3 = *(Function **)(&(p_Var10[1]._M_parent)->_M_color + sVar13 * 2);
          cVar8 = std::
                  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (key_type *)pFVar3);
          duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar13 + 1;
          if ((cVar8._M_node == (_Base_ptr)&duplicates) &&
             (lVar17 = local_48, sVar13 + 1 < local_f0)) {
            do {
              right = *(Function **)(&(p_Var10[1]._M_parent)->_M_color + lVar17 * 2);
              cVar8 = std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)right);
              if ((cVar8._M_node == (_Base_ptr)&duplicates) &&
                 (bVar5 = FunctionUtils::equal(pFVar3,right), bVar5)) {
                pmVar9 = std::
                         map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                         ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                       *)local_b0,(key_type *)right);
                pcVar4 = (pFVar3->super_Importable).super_Named.name.super_IString.str._M_str;
                (pmVar9->super_IString).str._M_len =
                     (pFVar3->super_Importable).super_Named.name.super_IString.str._M_len;
                (pmVar9->super_IString).str._M_str = pcVar4;
                std::
                _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                ::_M_insert_unique<wasm::Name_const&>
                          ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                            *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (Name *)right);
              }
              lVar17 = lVar17 + 1;
            } while (iVar15 != (int)lVar17);
          }
          local_48 = local_48 + 1;
          sVar13 = duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count;
        } while (duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count != local_f8);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      module = local_e0;
    } while (p_Var10 != (_Rb_tree_node_base *)&hashGroups);
    if (replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) break;
    local_d0._8_8_ = 0;
    local_d0._M_unused._M_object = &replacements._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_b8 = std::
               _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DuplicateFunctionElimination.cpp:98:11)>
               ::_M_invoke;
    local_c0 = std::
               _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DuplicateFunctionElimination.cpp:98:11)>
               ::_M_manager;
    Module::removeFunctions(local_e0,(function<bool_(wasm::Function_*)> *)&local_d0);
    ppuVar14 = local_d8;
    if (local_c0 != (code *)0x0) {
      (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    OptUtils::replaceFunctions
              ((this->super_Pass).runner,module,
               (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                *)local_b0);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)local_b0);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                 *)&hashes.
                    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                 *)local_258);
    if (uVar6 == 0) {
      return;
    }
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_b0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
               *)&hashes.
                  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               *)local_258);
  return;
}

Assistant:

void run(Module* module) override {
    // Multiple iterations may be necessary: A and B may be identical only after
    // we see the functions C1 and C2 that they call are in fact identical.
    // Rarely, such "chains" can be very long, so we limit how many we do.
    auto& options = getPassOptions();
    Index limit;
    if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
      limit = module->functions.size(); // no limit
    } else if (options.optimizeLevel >= 2) {
      // 10 passes usually does most of the work, as this is typically
      // logarithmic
      limit = 10;
    } else {
      limit = 1;
    }
    while (limit > 0) {
      limit--;
      // Hash all the functions
      auto hashes = FunctionHasher::createMap(module);
      FunctionHasher(&hashes).run(getPassRunner(), module);
      // Find hash-equal groups
      std::map<uint32_t, std::vector<Function*>> hashGroups;
      ModuleUtils::iterDefinedFunctions(*module, [&](Function* func) {
        hashGroups[hashes[func]].push_back(func);
      });
      // Find actually equal functions and prepare to replace them
      std::map<Name, Name> replacements;
      std::set<Name> duplicates;
      for (auto& [_, group] : hashGroups) {
        Index size = group.size();
        if (size == 1) {
          continue;
        }
        // The groups should be fairly small, and even if a group is large we
        // should have almost all of them identical, so we should not hit actual
        // O(N^2) here unless the hash is quite poor.
        for (Index i = 0; i < size - 1; i++) {
          auto* first = group[i];
          if (duplicates.count(first->name)) {
            continue;
          }
          for (Index j = i + 1; j < size; j++) {
            auto* second = group[j];
            if (duplicates.count(second->name)) {
              continue;
            }
            if (FunctionUtils::equal(first, second)) {
              // great, we can replace the second with the first!
              replacements[second->name] = first->name;
              duplicates.insert(second->name);
            }
          }
        }
      }
      // perform replacements
      if (replacements.size() > 0) {
        // remove the duplicates
        module->removeFunctions(
          [&](Function* func) { return duplicates.count(func->name) > 0; });
        OptUtils::replaceFunctions(getPassRunner(), *module, replacements);
      } else {
        break;
      }
    }
  }